

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::ScatterLayerParams::ByteSizeLong(ScatterLayerParams *this)

{
  ScatterMode SVar1;
  int iVar2;
  int64 iVar3;
  size_t sVar4;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  ScatterLayerParams *this_local;
  
  sStack_18 = 0;
  iVar3 = axis(this);
  if (iVar3 != 0) {
    iVar3 = axis(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::Int64Size(iVar3);
    sStack_18 = sStack_18 + 1;
  }
  SVar1 = mode(this);
  if (SVar1 != SCATTER_UPDATE) {
    SVar1 = mode(this);
    sVar4 = google::protobuf::internal::WireFormatLite::EnumSize(SVar1);
    sStack_18 = sVar4 + 1 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t ScatterLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ScatterLayerParams)
  size_t total_size = 0;

  // int64 axis = 1;
  if (this->axis() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->axis());
  }

  // .CoreML.Specification.ScatterMode mode = 2;
  if (this->mode() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->mode());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}